

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O0

void __thiscall miniros::TransportPublisherLink::drop(TransportPublisherLink *this)

{
  bool bVar1;
  element_type *this_00;
  long in_RDI;
  PublisherLinkPtr *in_stack_00000028;
  SubscriptionPtr parent;
  DropReason in_stack_0000007c;
  Connection *in_stack_00000080;
  weak_ptr<miniros::Subscription> *in_stack_ffffffffffffffc8;
  __shared_ptr local_18 [24];
  
  *(undefined1 *)(in_RDI + 0x138) = 1;
  std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x511136);
  Connection::drop(in_stack_00000080,in_stack_0000007c);
  std::weak_ptr<miniros::Subscription>::lock(in_stack_ffffffffffffffc8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x511170);
    std::enable_shared_from_this<miniros::PublisherLink>::shared_from_this
              ((enable_shared_from_this<miniros::PublisherLink> *)this_00);
    Subscription::removePublisherLink
              (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               in_stack_00000028);
    std::shared_ptr<miniros::PublisherLink>::~shared_ptr
              ((shared_ptr<miniros::PublisherLink> *)0x5111a3);
  }
  std::shared_ptr<miniros::Subscription>::~shared_ptr((shared_ptr<miniros::Subscription> *)0x5111d9)
  ;
  return;
}

Assistant:

void TransportPublisherLink::drop()
{
  dropping_ = true;
  connection_->drop(Connection::Destructing);

  if (SubscriptionPtr parent = parent_.lock())
  {
    parent->removePublisherLink(shared_from_this());
  }
}